

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<int>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_int *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  bool *__lhs;
  vtable_type **prop;
  TypedAttribute<tinyusdz::Animatable<int>_> *this;
  PrimVar *this_00;
  string *psVar1;
  pointer this_01;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint32_t uVar5;
  value_type *value;
  ostream *poVar6;
  size_type sVar7;
  mapped_type *this_02;
  pointer pSVar8;
  UsdPrimvarReader_int *args;
  UsdPrimvarReader_int *pUVar9;
  char *pcVar10;
  undefined6 in_stack_fffffffffffffa28;
  char in_stack_fffffffffffffa2e;
  allocator in_stack_fffffffffffffa2f;
  allocator local_5c1;
  string *local_5c0;
  ParseResult ret;
  string attr_type_name;
  undefined1 local_558 [56];
  vtable_type *local_520;
  _Alloc_hider local_518;
  pointer local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  key_type local_4c8;
  string local_4a8 [32];
  ostringstream ss_e_1;
  undefined1 local_480 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [22];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0 [32];
  string local_2d0;
  optional<tinyusdz::Animatable<int>_> av;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = preader;
  local_5c0 = err;
  local_510 = (pointer)warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  pSVar8 = (pointer)(properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_508._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  this = &preader->fallback;
  local_508._M_allocated_capacity = (size_type)&(preader->fallback)._paths;
  local_520 = (vtable_type *)&(preader->fallback)._attrib;
  local_558._40_8_ = &preader->varname;
  local_558._32_8_ = &preader->result;
  local_558._48_8_ = &(preader->result)._actual_type_name;
  local_518._M_p = (pointer)&(preader->super_ShaderNode).super_UsdShadePrim.props;
  while( true ) {
    if (pSVar8 == (pointer)local_508._8_8_) break;
    __lhs = &pSVar8->blocked;
    ::std::__cxx11::string::string((string *)&local_310,(string *)__lhs);
    prop = &pSVar8[1].value.v_.vtable;
    ::std::__cxx11::string::string((string *)local_558,"inputs:fallback",(allocator *)&local_4c8);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar4 = ::std::__cxx11::string::compare((string *)&local_310);
    if (iVar4 == 0) {
      if (((ulong)pSVar8[0x12].value.v_.vtable & 0xfffffffe00000000) == 0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",
                   (allocator *)&attr_type_name);
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,(string *)local_558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if ((_Base_ptr)(pSVar8 + 4)[1].value.v_.storage.dynamic != (_Base_ptr)(pSVar8 + 4)[1].t) {
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   local_508._M_allocated_capacity,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(pSVar8 + 4 + 1));
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
      tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,&attr_type_name);
      if (_Var3) {
        ::std::__cxx11::string::_M_dispose();
LAB_001d8791:
        iVar4 = *(int *)((long)&pSVar8[0x12].value.v_.vtable + 4);
        if (iVar4 == 1) {
          bVar2 = Attribute::is_blocked((Attribute *)prop);
          if (bVar2) {
            (preader->fallback)._blocked = true;
          }
          this_00 = (PrimVar *)((long)&pSVar8[3].value.v_.storage + 8);
          bVar2 = primvar::PrimVar::has_value(this_00);
          if ((bVar2) ||
             (*(_Base_ptr *)((long)&pSVar8[4].value.v_.storage + 8) !=
              (_Base_ptr)pSVar8[4].value.v_.storage.dynamic)) {
            anon_unknown_0::ConvertToAnimatable<int>
                      ((optional<tinyusdz::Animatable<int>_> *)&ss_e_1,this_00);
            nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::
            optional<tinyusdz::Animatable<int>,_0>
                      (&av,(optional<tinyusdz::Animatable<int>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::~optional
                      ((optional<tinyusdz::Animatable<int>_> *)&ss_e_1);
            bVar2 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
                        ((optional<tinyusdz::Animatable<int>> *)local_520,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::~optional(&av);
            if (bVar2 != false) {
              AttrMetas::operator=(&this->_metas,(AttrMetas *)&pSVar8[5].value.v_.vtable);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_558);
              ret.code = Success;
            }
          }
          else if ((_Base_ptr)(pSVar8 + 4)[1].value.v_.storage.dynamic !=
                   (_Base_ptr)(pSVar8 + 4)[1].t) {
            AttrMetas::operator=(&this->_metas,(AttrMetas *)&pSVar8[5].value.v_.vtable);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,&local_310);
            ret.code = Success;
          }
        }
        else if (iVar4 == 0) {
          (preader->fallback)._value_empty = true;
          AttrMetas::operator=(&this->_metas,(AttrMetas *)&pSVar8[5].value.v_.vtable);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558)
          ;
          ret.code = Success;
        }
        else {
          ::std::__cxx11::string::assign((char *)&ret.err);
          ret.code = InternalError;
        }
      }
      else {
        tinyusdz::value::TypeTraits<int>::underlying_type_name_abi_cxx11_();
        _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var3) goto LAB_001d8791;
        ret.code = TypeMismatch;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar6 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ");
        poVar6 = ::std::operator<<(poVar6,(string *)local_558);
        poVar6 = ::std::operator<<(poVar6," expects type `");
        tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
        poVar6 = ::std::operator<<(poVar6,(string *)&ss_e_1);
        poVar6 = ::std::operator<<(poVar6,"` but defined as type `");
        poVar6 = ::std::operator<<(poVar6,(string *)&attr_type_name);
        ::std::operator<<(poVar6,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar4 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar2 = false;
      iVar4 = 3;
    }
    else {
      bVar2 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar6 = ::std::operator<<((ostream *)&av,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x101c);
        ::std::operator<<(poVar6," ");
        ::std::__cxx11::string::string
                  ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)local_558);
        args = (UsdPrimvarReader_int *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&attr_type_name,(string *)"inputs:fallback",
                   (char (*) [16])args,warn);
        poVar6 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar1 = local_5c0;
        if (local_5c0 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar1);
          ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        bVar2 = false;
        iVar4 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:varname");
      pUVar9 = args;
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&av,"inputs:varname",(allocator *)&ss_e_1);
        sVar7 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&av);
        ::std::__cxx11::string::_M_dispose();
        pUVar9 = args;
        if (sVar7 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::string((string *)&local_2d0,(string *)__lhs);
          warn = (string *)&ss_e_1;
          ::std::__cxx11::string::string
                    ((string *)warn,"inputs:varname",(allocator *)&attr_type_name);
          args = (UsdPrimvarReader_int *)prop;
          err = (string *)&av;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret,&table,&local_2d0,(Property *)prop,warn,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret.code == TypeMismatch) {
            ::std::__cxx11::string::string(local_2f0,(string *)__lhs);
            warn = &attr_type_name;
            ::std::__cxx11::string::string((string *)warn,"inputs:varname",(allocator *)local_558);
            args = (UsdPrimvarReader_int *)prop;
            err = (string *)local_558._40_8_;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)&ss_e_1,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2f0,(string *)prop,(Property *)warn,(string *)local_558._40_8_,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa2f,
                                   CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)));
            ret.code = _ss_e_1;
            ::std::__cxx11::string::operator=((string *)&ret.err,(string *)local_480);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (ret.code != Success) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x102c);
              ::std::operator<<(poVar6," ");
              ::std::__cxx11::string::string
                        ((string *)local_558,"Faied to parse inputs:varname: {}",
                         (allocator *)&local_4c8);
              fmt::format<std::__cxx11::string>
                        ((string *)&attr_type_name,(fmt *)local_558,(string *)&ret.err,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar6 = ::std::operator<<((ostream *)&ss_e_1,(string *)&attr_type_name);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (local_5c0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                psVar1 = local_5c0;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&attr_type_name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_558,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5c0);
                ::std::__cxx11::string::operator=((string *)psVar1,(string *)&attr_type_name);
                ::std::__cxx11::string::_M_dispose();
LAB_001d8f4b:
                ::std::__cxx11::string::_M_dispose();
              }
LAB_001d8f50:
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar4 = 1;
              goto LAB_001d8f62;
            }
            bVar2 = false;
            iVar4 = 3;
          }
          else if (ret.code == Success) {
            bVar2 = ConvertTokenAttributeToStringAttribute
                              ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av,
                               (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_558._40_8_);
            if (!bVar2) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1023);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)&ss_e_1,
                                         "Failed to convert inputs:varname token type to string type."
                                        );
              ::std::operator<<(poVar6,"\n");
              psVar1 = local_5c0;
              if (local_5c0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&attr_type_name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_558,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar1);
                ::std::__cxx11::string::operator=((string *)psVar1,(string *)&attr_type_name);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001d8f4b;
              }
              goto LAB_001d8f50;
            }
            iVar4 = 3;
LAB_001d8f62:
            bVar2 = false;
          }
          else {
            iVar4 = 0;
            bVar2 = true;
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          pUVar9 = args;
          if (!bVar2) goto LAB_001d94d5;
        }
      }
      ::std::__cxx11::string::string(local_4a8,(string *)__lhs);
      ::std::__cxx11::string::string((string *)&local_4c8,"outputs:result",&local_5c1);
      local_480._0_8_ = local_470;
      local_480._8_8_ = 0;
      local_470[0]._M_local_buf[0] = '\0';
      iVar4 = ::std::__cxx11::string::compare(local_4a8);
      if (iVar4 == 0) {
        sVar7 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,&local_4c8);
        args = (UsdPrimvarReader_int *)local_558;
        if (sVar7 == 0) {
          bVar2 = Property::is_attribute_connection((Property *)prop);
          if (bVar2) {
            _ss_e_1 = ConnectionNotAllowed;
            ::std::__cxx11::string::assign(local_480);
            args = pUVar9;
          }
          else if (*(int *)((long)&pSVar8[0x12].value.v_.vtable + 4) == 0) {
            Attribute::type_name_abi_cxx11_((string *)&av,(Attribute *)prop);
            in_stack_fffffffffffffa2e = tinyusdz::value::IsRoleType((string *)&av);
            tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&av);
            ::std::__cxx11::string::_M_dispose();
            if (_Var3) {
              (preader->result)._authored = true;
              AttrMetas::operator=
                        ((AttrMetas *)local_558._32_8_,(AttrMetas *)&pSVar8[5].value.v_.vtable);
LAB_001d90e6:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&local_4c8);
              _ss_e_1 = Success;
              args = pUVar9;
            }
            else {
              if (in_stack_fffffffffffffa2e == '\0') {
                pcVar10 = "Property type mismatch. {} expects type `{}` but defined as type `{}`.";
              }
              else {
                uVar5 = tinyusdz::value::GetUnderlyingTypeId((string *)&av);
                if (uVar5 == 0xf) {
                  (preader->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)local_558._48_8_);
                  AttrMetas::operator=
                            ((AttrMetas *)local_558._32_8_,(AttrMetas *)&pSVar8[5].value.v_.vtable);
                  goto LAB_001d90e6;
                }
                pcVar10 = 
                "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                ;
              }
              _ss_e_1 = TypeMismatch;
              ::std::__cxx11::string::string
                        ((string *)&attr_type_name,pcVar10,(allocator *)&stack0xfffffffffffffa2f);
              tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
              warn = (string *)&av;
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&ret,(fmt *)&attr_type_name,&local_4c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                         warn,err);
              ::std::__cxx11::string::operator=((string *)local_480,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ::std::__cxx11::string::assign(local_480);
            _ss_e_1 = InvalidConnection;
            args = pUVar9;
          }
        }
        else {
          _ss_e_1 = AlreadyProcessed;
          args = pUVar9;
        }
      }
      else {
        _ss_e_1 = Unmatched;
        args = pUVar9;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((_ss_e_1 & ~AlreadyProcessed) == Success) {
        iVar4 = 3;
LAB_001d934b:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (_ss_e_1 != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar6 = ::std::operator<<((ostream *)&av,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1031);
          ::std::operator<<(poVar6," ");
          ::std::__cxx11::string::string
                    ((string *)&attr_type_name,
                     "Parsing shader output property `{}` failed. Error: {}",(allocator *)local_558)
          ;
          args = (UsdPrimvarReader_int *)local_480;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&attr_type_name,(string *)"outputs:result",
                     (char (*) [15])args,warn);
          poVar6 = ::std::operator<<((ostream *)&av,(string *)&ret);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c0;
          if (local_5c0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar4 = 1;
          goto LAB_001d934b;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001d94d5;
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar7 == 0) {
        this_02 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                *)local_518._M_p,(key_type *)__lhs);
        Property::operator=(this_02,(Property *)prop);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar7 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar6 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1033);
        ::std::operator<<(poVar6," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar6 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::_M_dispose();
        this_01 = local_510;
        if (local_510 != (pointer)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5c0);
          ::std::__cxx11::string::operator=((string *)this_01,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001d94d5:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
    pSVar8 = (pointer)::std::_Rb_tree_increment((_Rb_tree_node_base *)pSVar8);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return false;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_int>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_int *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_int,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        ret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
        if (ret.code == ParseResult::ResultCode::Success) {
          // ok
          continue;
        } else {
          PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", ret.err));
        }
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_int, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_int, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return false;
}